

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O1

void chrono::utils::AddTriangleGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,ChVector<double> *vertA
               ,ChVector<double> *vertB,ChVector<double> *vertC,string *name,ChVector<double> *pos,
               ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  _Atomic_word *this;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  _func_int **pp_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double *pdVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  ChTriangleMeshShape *this_01;
  ChBody *model;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  shared_ptr<chrono::ChVisualShape> local_160;
  shared_ptr<chrono::ChVisualMaterial> local_150;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_140;
  undefined1 local_130 [48];
  string *local_100;
  ChSystem *local_f8;
  element_type *local_f0;
  ChFrame<double> local_e8;
  ChQuaternion<double> local_58;
  
  local_100 = name;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x110);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b66ac8;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ChTriangleMeshConnected_00b669b8;
  this_00[1]._M_use_count = 0;
  this_00[1]._M_weak_count = 0;
  this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[2]._M_use_count = 0;
  this_00[2]._M_weak_count = 0;
  this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._M_use_count = 0;
  this_00[5]._M_weak_count = 0;
  this_00[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[6]._M_use_count = 0;
  this_00[6]._M_weak_count = 0;
  this_00[7]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[7]._M_use_count = 0;
  this_00[7]._M_weak_count = 0;
  this_00[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[8]._M_use_count = 0;
  this_00[8]._M_weak_count = 0;
  this_00[9]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[9]._M_use_count = 0;
  this_00[9]._M_weak_count = 0;
  this_00[10]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[10]._M_use_count = 0;
  this_00[10]._M_weak_count = 0;
  this_00[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._M_use_count = 0;
  this_00[0xb]._M_weak_count = 0;
  this_00[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xc]._M_use_count = 0;
  this_00[0xc]._M_weak_count = 0;
  this_00[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xb]._M_use_count = 0;
  this_00[0xb]._M_weak_count = 0;
  this_00[0xc]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xc]._M_use_count = 0;
  this_00[0xc]._M_weak_count = 0;
  this_00[0xd]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xd]._M_use_count = 0;
  this_00[0xd]._M_weak_count = 0;
  this_00[0xe]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[0xe]._M_use_count = 0;
  this_00[0xe]._M_weak_count = 0;
  this_00[0xf]._vptr__Sp_counted_base = (_func_int **)(this_00 + 0x10);
  this_00[0xf]._M_use_count = 0;
  this_00[0xf]._M_weak_count = 0;
  *(undefined1 *)&this_00[0x10]._vptr__Sp_counted_base = 0;
  if (this_00[2]._vptr__Sp_counted_base != (_func_int **)0x0) {
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  }
  this = &this_00[1]._M_use_count;
  if (this_00[8]._vptr__Sp_counted_base != *(_func_int ***)&this_00[7]._M_use_count) {
    this_00[8]._vptr__Sp_counted_base = *(_func_int ***)&this_00[7]._M_use_count;
  }
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertA);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertB);
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
            ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)this,
             vertC);
  local_e8._vptr_ChFrame = (_func_int **)0x100000000;
  local_e8.coord.pos.m_data[0] = (double)CONCAT44(local_e8.coord.pos.m_data[0]._4_4_,2);
  std::vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>>::
  emplace_back<chrono::ChVector<int>>
            ((vector<chrono::ChVector<int>,std::allocator<chrono::ChVector<int>>> *)
             &this_00[7]._M_use_count,(ChVector<int> *)&local_e8);
  lVar12 = (long)this_00[2]._vptr__Sp_counted_base - *(long *)&this_00[1]._M_use_count;
  if (lVar12 != 0) {
    lVar12 = (lVar12 >> 3) * -0x5555555555555555;
    lVar12 = lVar12 + (ulong)(lVar12 == 0);
    pdVar10 = (double *)(*(long *)&this_00[1]._M_use_count + 0x10);
    auVar13 = ZEXT816(0xbff0000000000000);
    auVar14 = ZEXT816(0x4000000000000000);
    do {
      dVar1 = rot->m_data[0];
      dVar2 = rot->m_data[1];
      dVar7 = dVar1 * dVar1;
      dVar3 = rot->m_data[2];
      dVar4 = rot->m_data[3];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar7 + dVar2 * dVar2;
      auVar19 = vfmadd213sd_fma(auVar19,auVar14,auVar13);
      dVar8 = dVar2 * dVar3 - dVar4 * dVar1;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = pdVar10[-2];
      dVar5 = pdVar10[-1];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar5 * (dVar8 + dVar8);
      auVar19 = vfmadd231sd_fma(auVar24,auVar25,auVar19);
      dVar8 = dVar1 * dVar3 + dVar4 * dVar2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *pdVar10;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar8 + dVar8;
      auVar19 = vfmadd213sd_fma(auVar20,auVar26,auVar19);
      dVar8 = dVar2 * dVar3 + dVar4 * dVar1;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar7 + dVar3 * dVar3;
      auVar20 = vfmadd213sd_fma(auVar22,auVar14,auVar13);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar8 + dVar8;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar5 * auVar20._0_8_;
      auVar20 = vfmadd231sd_fma(auVar23,auVar25,auVar15);
      dVar8 = dVar4 * dVar3 - dVar1 * dVar2;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar8 + dVar8;
      auVar20 = vfmadd213sd_fma(auVar16,auVar26,auVar20);
      dVar8 = dVar4 * dVar2 - dVar1 * dVar3;
      dVar1 = dVar1 * dVar2 + dVar4 * dVar3;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar8 + dVar8;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar5 * (dVar1 + dVar1);
      auVar16 = vfmadd231sd_fma(auVar21,auVar25,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar4 * dVar4 + dVar7;
      auVar15 = vfmadd213sd_fma(auVar18,auVar14,auVar13);
      auVar15 = vfmadd213sd_fma(auVar15,auVar26,auVar16);
      dVar1 = pos->m_data[1];
      dVar2 = pos->m_data[2];
      pdVar10[-2] = auVar19._0_8_ + pos->m_data[0];
      pdVar10[-1] = auVar20._0_8_ + dVar1;
      *pdVar10 = auVar15._0_8_ + dVar2;
      pdVar10 = pdVar10 + 3;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  peVar6 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var11 = (body->collision_model).
            super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
  }
  local_130._32_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_130._40_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_)->_M_use_count + 1;
    }
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_58.m_data[2] = 0.0;
  local_e8.coord.pos.m_data[0] = 0.0;
  local_e8.coord.pos.m_data[1] = 0.0;
  local_e8.coord.pos.m_data[2] = 0.0;
  local_e8.coord.rot.m_data[1] = 0.0;
  local_e8.coord.rot.m_data[2] = 0.0;
  local_e8.coord.rot.m_data[3] = 0.0;
  local_e8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_e8.coord.rot.m_data[0] = 1.0;
  local_e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_130._16_8_ = (element_type *)(this_00 + 1);
  local_130._24_8_ = this_00;
  (*peVar6->_vptr_ChCollisionModel[0x10])
            (peVar6,local_130 + 0x20,local_130 + 0x10,0,0,&local_58,&local_e8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._40_8_);
  }
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    pp_Var9 = local_e8._vptr_ChFrame;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.coord.pos.m_data[0]);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pp_Var9 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var11->_M_use_count = 1;
      p_Var11->_M_weak_count = 1;
      p_Var11->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b33b18;
      local_130._0_8_ = p_Var11 + 1;
      p_Var11[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[1]._M_use_count = 0;
      p_Var11[1]._M_weak_count = 0;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[2]._M_use_count = 0;
      p_Var11[2]._M_weak_count = 0;
      p_Var11[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[2]._M_use_count = 0;
      p_Var11[2]._M_weak_count = 0;
      p_Var11[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var11[3]._M_use_count = 0;
      p_Var11[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = 2;
      }
      model = (ChBody *)local_130;
      local_130._8_8_ = p_Var11;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
    this_01 = (ChTriangleMeshShape *)
              ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)model);
    ChTriangleMeshShape::ChTriangleMeshShape(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
              (&local_168,this_01);
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    local_140.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)(this_00 + 1);
    local_140.
    super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    ChTriangleMeshShape::SetMesh(this_01,&local_140,true);
    if (local_140.
        super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_140.
                 super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    std::__cxx11::string::_M_assign((string *)&this_01->name);
    local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>)
            ._M_refcount._M_pi;
    if (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial((ChVisualShape *)this_01,&local_150);
    if (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    local_160.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_168._M_pi;
    if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
      }
    }
    local_58.m_data[0] = 1.0;
    local_58.m_data[1] = 0.0;
    local_58.m_data[2] = 0.0;
    local_58.m_data[3] = 0.0;
    local_e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_e8.coord.pos.m_data[0] = 0.0;
    local_e8.coord.pos.m_data[1] = 0.0;
    local_e8.coord.pos.m_data[2] = 0.0;
    local_e8.coord.rot.m_data[0] = 1.0;
    local_e8.coord.rot.m_data[1] = 0.0;
    local_e8.coord.rot.m_data[2] = 0.0;
    local_e8.coord.rot.m_data[3] = 0.0;
    local_160.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this_01;
    ChMatrix33<double>::ChMatrix33(&local_e8.Amatrix,&local_58);
    ChVisualModel::AddShape((ChVisualModel *)local_f8,&local_160,&local_e8);
    if (local_160.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_160.super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_f0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0);
    }
    if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
    }
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void AddTriangleGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         const ChVector<>& vertA,
                         const ChVector<>& vertB,
                         const ChVector<>& vertC,
                         const std::string& name,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    auto trimesh = chrono_types::make_shared<geometry::ChTriangleMeshConnected>();
    trimesh->m_vertices.clear();
    trimesh->m_face_v_indices.clear();
    trimesh->m_vertices.push_back(vertA);
    trimesh->m_vertices.push_back(vertB);
    trimesh->m_vertices.push_back(vertC);
    trimesh->m_face_v_indices.push_back(ChVector<int>(0, 1, 2));

    for (int i = 0; i < trimesh->m_vertices.size(); i++)
        trimesh->m_vertices[i] = pos + rot.Rotate(trimesh->m_vertices[i]);

    body->GetCollisionModel()->AddTriangleMesh(material, trimesh, false, false);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_shape->SetMesh(trimesh);
        trimesh_shape->SetName(name);
        trimesh_shape->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>());
    }
}